

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::e_formatter::format(e_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  scoped_pad p;
  scoped_pad sStack_58;
  format_int local_30;
  
  lVar4 = (msg->time).__d.__r;
  uVar3 = (lVar4 / 1000000000) * -1000 + lVar4 / 1000000;
  uVar2 = (uint)uVar3;
  if ((this->super_flag_formatter).padinfo_.width_ == 0) {
    uVar1 = 0x1f;
    if ((uVar2 | 1) != 0) {
      for (; (uVar2 | 1) >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = (uVar1 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    uVar2 = (uVar1 - (uVar2 < *(uint *)(fmt::v5::internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32
                                       + (ulong)uVar1 * 4))) + 1;
    if (uVar2 < 3) {
      fmt::v5::internal::basic_buffer<char>::append<char>
                (&dest->super_basic_buffer<char>,"0000000000000000000",
                 "0000000000000000000" + (3 - (ulong)uVar2));
    }
    sStack_58.spaces_._M_len =
         (size_t)fmt::v5::format_int::format_decimal((format_int *)&sStack_58,uVar3 & 0xffffffff);
    if ((long)((long)&sStack_58 - sStack_58.spaces_._M_len) < -0x15) goto LAB_001b8976;
    fmt::v5::internal::basic_buffer<char>::append<char>
              (&dest->super_basic_buffer<char>,(char *)sStack_58.spaces_._M_len,
               (char *)(sStack_58.spaces_._M_len +
                       ((long)&sStack_58 - sStack_58.spaces_._M_len) + 0x15));
  }
  else {
    scoped_pad::scoped_pad(&sStack_58,3,&(this->super_flag_formatter).padinfo_,dest);
    uVar1 = 0x1f;
    if ((uVar2 | 1) != 0) {
      for (; (uVar2 | 1) >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = (uVar1 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    uVar2 = (uVar1 - (uVar2 < *(uint *)(fmt::v5::internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32
                                       + (ulong)uVar1 * 4))) + 1;
    if (uVar2 < 3) {
      fmt::v5::internal::basic_buffer<char>::append<char>
                (&dest->super_basic_buffer<char>,"0000000000000000000",
                 "0000000000000000000" + (3 - (ulong)uVar2));
    }
    local_30.str_ = fmt::v5::format_int::format_decimal(&local_30,uVar3 & 0xffffffff);
    lVar4 = (long)&local_30 - (long)local_30.str_;
    if (lVar4 < -0x15) {
LAB_001b8976:
      __assert_fail("(value >= 0) && \"negative value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/core.h"
                    ,0xde,
                    "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                   );
    }
    fmt::v5::internal::basic_buffer<char>::append<char>
              (&dest->super_basic_buffer<char>,local_30.str_,local_30.str_ + lVar4 + 0x15);
    scoped_pad::~scoped_pad(&sStack_58);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        auto millis = fmt_helper::time_fraction<std::chrono::milliseconds>(msg.time);
        if (padinfo_.enabled())
        {
            const size_t field_size = 3;
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        }
        else
        {
            fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
        }
    }